

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenFieldsNumber(CppGenerator *this,StructDef *struct_def)

{
  difference_type __val;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  __val = std::
          __count_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,__gnu_cxx::__ops::_Iter_pred<flatbuffers::cpp::CppGenerator::GenFieldsNumber(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const*)_1_>>
                    ((struct_def->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (struct_def->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"FIELD_COUNT",&local_71);
  std::__cxx11::to_string(&local_30,__val);
  CodeWriter::SetValue(&this->code_,&local_70,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"  static constexpr size_t fields_number = {{FIELD_COUNT}};",
             (allocator<char> *)&local_70);
  CodeWriter::operator+=(&this->code_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void GenFieldsNumber(const StructDef &struct_def) {
    const auto non_deprecated_field_count = std::count_if(
        struct_def.fields.vec.begin(), struct_def.fields.vec.end(),
        [](const FieldDef *field) { return !field->deprecated; });
    code_.SetValue(
        "FIELD_COUNT",
        std::to_string(static_cast<long long>(non_deprecated_field_count)));
    code_ += "  static constexpr size_t fields_number = {{FIELD_COUNT}};";
  }